

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_tsfb.c
# Opt level: O2

int jpc_tsfb_synthesize2
              (jpc_tsfb_t *tsfb,jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride,
              int numlvls)

{
  int iVar1;
  int xstart_00;
  
  if ((0 < numlvls) &&
     (xstart_00 = xstart + 1 >> 1, iVar1 = ystart + 1 >> 1,
     iVar1 = jpc_tsfb_synthesize2
                       (tsfb,a,xstart_00,iVar1,(width + xstart + 1 >> 1) - xstart_00,
                        (ystart + height + 1 >> 1) - iVar1,stride,numlvls + -1), iVar1 != 0)) {
    return -1;
  }
  if ((0 < height && 0 < width) &&
     (iVar1 = (*tsfb->qmfb->synthesize)(a,xstart,ystart,width,height,stride), iVar1 != 0)) {
    return -1;
  }
  return 0;
}

Assistant:

static int jpc_tsfb_synthesize2(jpc_tsfb_t *tsfb, jpc_fix_t *a, int xstart, int ystart,
  int width, int height, int stride, int numlvls)
{
	if (numlvls > 0) {
		if (jpc_tsfb_synthesize2(tsfb, a, JPC_CEILDIVPOW2(xstart, 1),
		  JPC_CEILDIVPOW2(ystart, 1), JPC_CEILDIVPOW2(xstart + width,
		  1) - JPC_CEILDIVPOW2(xstart, 1), JPC_CEILDIVPOW2(ystart +
		  height, 1) - JPC_CEILDIVPOW2(ystart, 1), stride, numlvls -
		  1)) {
			return -1;
		}
	}
	if (width > 0 && height > 0) {
		if ((*tsfb->qmfb->synthesize)(a, xstart, ystart, width, height, stride)) {
			return -1;
		}
	}
	return 0;
}